

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

wchar_t __thiscall
CVmFormatter::parse_html_markup(CVmFormatter *this,wchar_t c,char **sp,size_t *slenp)

{
  int iVar1;
  undefined4 uVar2;
  ulong uVar3;
  int in_ESI;
  CVmFormatter *in_RDI;
  bool bVar4;
  wchar_t ent;
  wchar_t htmlchar;
  size_t cur;
  wchar_t *p;
  wchar_t dashbuf [100];
  size_t DASHBUFLEN;
  int rem;
  int attr;
  int is_end_tag;
  wchar_t *dst;
  wchar_t tagbuf [50];
  size_t MAX_TAG_SIZE;
  wchar_t *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  char **in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd48;
  vm_nl_type nl;
  CVmFormatter *in_stack_fffffffffffffd50;
  undefined4 *puVar5;
  undefined4 local_2a8 [6];
  wchar_t *in_stack_fffffffffffffd70;
  wchar_t *in_stack_fffffffffffffd78;
  size_t *in_stack_fffffffffffffd90;
  char **in_stack_fffffffffffffd98;
  wchar_t *in_stack_fffffffffffffda0;
  CVmFormatter *in_stack_fffffffffffffda8;
  int local_10c;
  uint local_108;
  uint local_104;
  wchar_t *local_100;
  wchar_t local_f8 [50];
  wchar_t local_30 [7];
  wchar_t local_14;
  wchar_t local_4;
  
  if (in_ESI == 0x3c) {
    local_30[0] = L'2';
    local_30[1] = L'\0';
    local_14 = next_wchar(in_stack_fffffffffffffd28,
                          (size_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    if ((local_14 == L'/') || (local_14 == L'\\')) {
      local_104 = 1;
      local_14 = next_wchar(in_stack_fffffffffffffd28,
                            (size_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))
      ;
    }
    else {
      local_104 = 0;
    }
    local_100 = local_f8;
    while( true ) {
      nl = (vm_nl_type)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      bVar4 = false;
      if ((local_14 != L'\0') && (bVar4 = false, local_14 != L' ')) {
        bVar4 = local_14 != L'>';
      }
      if (!bVar4) break;
      if (local_100 + 1 < local_30) {
        *local_100 = local_14;
        local_100 = local_100 + 1;
      }
      local_14 = next_wchar(in_stack_fffffffffffffd28,
                            (size_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))
      ;
    }
    *local_100 = L'\0';
    iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    if (iVar1 == 0) {
      iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      if ((((iVar1 == 0) &&
           (iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
           iVar1 == 0)) &&
          (iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
          iVar1 == 0)) &&
         (iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
         iVar1 == 0)) {
        iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
        if (iVar1 == 0) {
          iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
          if ((iVar1 == 0) || (in_RDI->html_in_ignore_ != 0)) {
            iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
            if ((iVar1 == 0) &&
               (iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
               iVar1 == 0)) {
              iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
              if (iVar1 == 0) {
                iVar1 = CVmCaseFoldStr::wstreq(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                if (iVar1 == 0) {
                  iVar1 = CVmCaseFoldStr::wstreq
                                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                  if (iVar1 == 0) {
                    iVar1 = CVmCaseFoldStr::wstreq
                                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                    if (iVar1 == 0) {
                      iVar1 = CVmCaseFoldStr::wstreq
                                        (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                      if (iVar1 == 0) {
                        iVar1 = CVmCaseFoldStr::wstreq
                                          (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                        if ((iVar1 == 0) &&
                           (iVar1 = CVmCaseFoldStr::wstreq
                                              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
                           iVar1 == 0)) {
                          iVar1 = CVmCaseFoldStr::wstreq
                                            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                          if (iVar1 == 0) {
                            iVar1 = CVmCaseFoldStr::wstreq
                                              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
                            if (iVar1 == 0) {
                              iVar1 = CVmCaseFoldStr::wstreq
                                                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70
                                                );
                              if (iVar1 == 0) {
                                iVar1 = CVmCaseFoldStr::wstreq
                                                  (in_stack_fffffffffffffd78,
                                                   in_stack_fffffffffffffd70);
                                if (iVar1 != 0) {
                                  if (local_104 == 0) {
                                    in_RDI->html_pre_level_ = in_RDI->html_pre_level_ + 1;
                                  }
                                  write_blank_line((CVmFormatter *)
                                                   CONCAT44(in_stack_fffffffffffffd24,
                                                            in_stack_fffffffffffffd20));
                                  if ((local_104 != 0) && (in_RDI->html_pre_level_ != 0)) {
                                    in_RDI->html_pre_level_ = in_RDI->html_pre_level_ + -1;
                                  }
                                }
                              }
                              else if (in_RDI->html_in_ignore_ == 0) {
                                in_RDI->field_0xefe8 = in_RDI->field_0xefe8 & 0xef | 0x10;
                              }
                            }
                            else {
                              (*in_RDI->_vptr_CVmFormatter[0x10])(in_RDI,(ulong)local_104);
                            }
                          }
                          else {
                            (*in_RDI->_vptr_CVmFormatter[0x11])(in_RDI,(ulong)local_104);
                          }
                        }
                        else if (local_104 == 0) {
                          in_RDI->html_in_ignore_ = in_RDI->html_in_ignore_ + 1;
                        }
                        else {
                          in_RDI->html_in_ignore_ = in_RDI->html_in_ignore_ + -1;
                        }
                      }
                      else if (local_104 == 0) {
                        if (in_RDI->html_in_title_ == 0) {
                          in_RDI->html_title_ptr_ = in_RDI->html_title_buf_;
                        }
                        in_RDI->html_in_ignore_ = in_RDI->html_in_ignore_ + 1;
                        in_RDI->html_in_title_ = in_RDI->html_in_title_ + 1;
                      }
                      else {
                        in_RDI->html_in_ignore_ = in_RDI->html_in_ignore_ + -1;
                        in_RDI->html_in_title_ = in_RDI->html_in_title_ + -1;
                        if (((in_RDI->html_in_title_ == 0) &&
                            (in_RDI->html_title_ptr_ != (char *)0x0)) &&
                           (*in_RDI->html_title_ptr_ = '\0', in_RDI->html_in_ignore_ == 0)) {
                          (*in_RDI->_vptr_CVmFormatter[10])(in_RDI,in_RDI->html_title_buf_);
                        }
                      }
                    }
                    else if (in_RDI->html_in_ignore_ == 0) {
                      if (local_104 == 0) {
                        in_RDI->html_quote_level_ = in_RDI->html_quote_level_ + 1;
                        uVar2 = 0x2018;
                        if ((in_RDI->html_quote_level_ & 1U) == 1) {
                          uVar2 = 0x201c;
                        }
                      }
                      else {
                        uVar2 = 0x2019;
                        if ((in_RDI->html_quote_level_ & 1U) == 1) {
                          uVar2 = 0x201d;
                        }
                      }
                      buffer_char((CVmFormatter *)CONCAT44(uVar2,in_stack_fffffffffffffd40),
                                  (wchar_t)((ulong)in_RDI >> 0x20));
                      if (local_104 != 0) {
                        in_RDI->html_quote_level_ = in_RDI->html_quote_level_ + -1;
                      }
                    }
                  }
                  else if (in_RDI->html_in_ignore_ == 0) {
                    flush(in_stack_fffffffffffffd50,nl);
                    local_10c = (*in_RDI->console_->_vptr_CVmConsole[6])();
                    local_10c = local_10c + -1;
                    while (0 < local_10c) {
                      uVar3 = (ulong)local_10c;
                      if (99 < uVar3) {
                        uVar3 = 99;
                      }
                      local_10c = local_10c - (int)uVar3;
                      puVar5 = local_2a8;
                      for (; uVar3 != 0; uVar3 = uVar3 - 1) {
                        *puVar5 = 0x2d;
                        puVar5 = puVar5 + 1;
                      }
                      *puVar5 = 0;
                      buffer_wstring((CVmFormatter *)
                                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                     in_stack_fffffffffffffd18);
                    }
                    write_blank_line((CVmFormatter *)
                                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
                  }
                }
                else if ((in_RDI->html_in_ignore_ == 0) && (local_104 == 0)) {
                  in_RDI->field_0xefe8 = in_RDI->field_0xefe8 & 0xfb | 4;
                }
              }
              else if (in_RDI->html_in_ignore_ == 0) {
                if (local_104 == 0) {
                  in_RDI->field_0xefe8 = in_RDI->field_0xefe8 & 0xfd | 2;
                  push_color((CVmFormatter *)
                             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
                }
                else {
                  pop_color(in_RDI);
                }
              }
            }
            else {
              in_RDI->field_0xefe8 = in_RDI->field_0xefe8 & 0xfe | 1;
            }
          }
          else if (in_RDI->html_in_ignore_ == 0) {
            expand_pending_tab((CVmFormatter *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               (int)((ulong)in_RDI >> 0x20));
            in_RDI->field_0xefe8 = in_RDI->field_0xefe8 & 0xf7 | 8;
            in_RDI->new_tab_entry_ = (CVmFmtTabStop *)0x0;
            in_RDI->new_tab_align_ = VMFMT_TAB_NONE;
            in_RDI->new_tab_dp_ = L'\0';
          }
        }
        else if (in_RDI->html_in_ignore_ == 0) {
          write_blank_line((CVmFormatter *)
                           CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        }
      }
      else if (in_RDI->html_in_ignore_ == 0) {
        if (local_104 == 0) {
          push_color((CVmFormatter *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
          switch(local_f8[0]) {
          case L'B':
          case L'b':
            local_108 = 1;
            break;
          case L'E':
          case L'e':
            local_108 = 1;
            break;
          case L'I':
          case L'i':
            local_108 = 2;
            break;
          case L'S':
          case L's':
            local_108 = 0;
          }
          (in_RDI->cur_color_).attr = local_108 | (in_RDI->cur_color_).attr;
        }
        else {
          pop_color(in_RDI);
        }
      }
    }
    else if (in_RDI->html_in_ignore_ == 0) {
      if (in_RDI->linepos_ == 0) {
        in_RDI->html_defer_br_ = HTML_DEFER_BR_BLANK;
      }
      else {
        in_RDI->html_defer_br_ = HTML_DEFER_BR_FLUSH;
      }
    }
    in_RDI->html_parse_state_ = VMCON_HPS_TAG;
    local_4 = local_14;
  }
  else if (in_ESI == 0x26) {
    local_14 = parse_entity(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                            in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    buffer_char((CVmFormatter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                (wchar_t)((ulong)in_RDI >> 0x20));
    local_4 = local_14;
  }
  else {
    buffer_char((CVmFormatter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                (wchar_t)((ulong)in_RDI >> 0x20));
    local_4 = next_wchar(in_stack_fffffffffffffd28,
                         (size_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  }
  return local_4;
}

Assistant:

wchar_t CVmFormatter::parse_html_markup(VMG_ wchar_t c,
                                        const char **sp, size_t *slenp)
{
    /* check what we have */
    if (c == '<')
    {
        const size_t MAX_TAG_SIZE = 50;
        wchar_t tagbuf[MAX_TAG_SIZE];
        wchar_t *dst;
        int is_end_tag;
        
        /* skip the opening '<' */
        c = next_wchar(sp, slenp);
        
        /* note if this is a closing tag */
        if (c == '/' || c == '\\')
        {
            /* it's an end tag - note it and skip the slash */
            is_end_tag = TRUE;
            c = next_wchar(sp, slenp);
        }
        else
            is_end_tag = FALSE;
        
        /* 
         *   find the end of the tag name - the tag continues to the next
         *   space, '>', or end of line 
         */
        for (dst = tagbuf ; c != '\0' && c != ' ' && c != '>' ;
             c = next_wchar(sp, slenp))
        {
            /* add this to the tag buffer if it fits */
            if (dst + 1 < tagbuf + MAX_TAG_SIZE)
                *dst++ = c;
        }
        
        /* null-terminate the tag name */
        *dst = '\0';
        
        /*
         *   Check to see if we recognize the tag.  We only recognize a few
         *   simple tags that map easily to character mode.  
         */
        if (CVmCaseFoldStr::wstreq(tagbuf, L"br"))
        {
            /* 
             *   line break - if there's anything buffered up, just flush the
             *   current line, otherwise write out a blank line 
             */
            if (html_in_ignore_)
                /* suppress in ignore mode */;
            else if (linepos_ != 0)
                html_defer_br_ = HTML_DEFER_BR_FLUSH;
            else
                html_defer_br_ = HTML_DEFER_BR_BLANK;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"b")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"i")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"em")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"strong"))
        {
            /* suppress in ignore mode */
            if (!html_in_ignore_)
            {
                /* check to see if this is a start or end tag */
                if (!is_end_tag)
                {
                    int attr;

                    /* it's a start tag - push the current attributes */
                    push_color();

                    /* figure the attribute we're adding */
                    switch(tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }

                    /* add the attribute */
                    cur_color_.attr |= attr;
                }
                else
                {
                    /* it's an end tag - just pop the saved attributes */
                    pop_color();
                }
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"p"))
        {
            /* paragraph - send out a blank line */
            if (!html_in_ignore_)
                write_blank_line(vmg0_);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"tab") && !html_in_ignore_)
        {
            if (!html_in_ignore_)
            {
                /* if we have a pending tab, handle it */
                expand_pending_tab(vmg_ TRUE);

                /* start a tab definition */
                html_in_tab_ = TRUE;

                /* the new tab has no known characteristics yet */
                new_tab_entry_ = 0;
                new_tab_align_ = VMFMT_TAB_NONE;
                new_tab_dp_ = L'\0';
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"img")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"sound"))
        {
            /* IMG and SOUND - allow ALT attributes */
            html_allow_alt_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"font"))
        {
            /* FONT - look for COLOR attribute */
            if (html_in_ignore_)
            {
                /* do nothing while ignoring tags */
            }
            else if (!is_end_tag)
            {
                /* enable the COLOR attribute */
                html_allow_color_ = TRUE;

                /* push the current color, in case we change it */
                push_color();
            }
            else
            {
                /* restore the color in the enclosing text */
                pop_color();
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"body"))
        {
            /* BODY - look for BGCOLOR and TEXT attributes */
            if (!html_in_ignore_ && !is_end_tag)
            {
                /* note that we're parsing a BODY tag */
                html_in_body_ = TRUE;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"hr"))
        {
            int rem;

            if (!html_in_ignore_)
            {
                /* start a new line */
                flush(vmg_ VM_NL_NEWLINE);

                /* write out underscores to the display width */
                for (rem = console_->get_line_width() - 1 ; rem > 0 ; )
                {
                    const size_t DASHBUFLEN = 100;
                    wchar_t dashbuf[DASHBUFLEN];
                    wchar_t *p;
                    size_t cur;

                    /* do as much as we can on this pass */
                    cur = rem;
                    if (cur > DASHBUFLEN - 1)
                        cur = DASHBUFLEN - 1;

                    /* deduct this from the total */
                    rem -= cur;

                    /* fill the buffer with dashes */
                    for (p = dashbuf ; cur != 0 ; --cur)
                        *p++ = '-';
                    *p = '\0';

                    /* write it out */
                    buffer_wstring(vmg_ dashbuf);
                }

                /* put a blank line after the underscores */
                write_blank_line(vmg0_);
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"q"))
        {
            wchar_t htmlchar;

            if (!html_in_ignore_)
            {
                /* if it's an open quote, increment the level */
                if (!is_end_tag)
                    ++html_quote_level_;

                /* add the open quote */
                htmlchar =
                    (!is_end_tag
                     ? ((html_quote_level_ & 1) == 1
                        ? 8220 : 8216)
                     : ((html_quote_level_ & 1) == 1
                        ? 8221 : 8217));

                /* write out the HTML quote character */
                buffer_char(vmg_ htmlchar);

                /* if it's a close quote, decrement the level */
                if (is_end_tag)
                    --html_quote_level_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"title"))
        {
            /* 
             *   Turn ignore mode on or off as appropriate, and turn on or
             *   off title mode as well.  
             */
            if (is_end_tag)
            {
                /* 
                 *   note that we're leaving an ignore section and a title
                 *   section 
                 */
                --html_in_ignore_;
                --html_in_title_;

                /*  
                 *   If we're no longer in a title, and we have a buffer
                 *   where we've gathered up the title string, call the OS
                 *   layer to tell it the title string, in case it wants to
                 *   change the window title or otherwise make use of the
                 *   title.  (Note that some streams don't bother keeping
                 *   track of the title at all, so we might not have a title
                 *   buffer.)  
                 */
                if (html_in_title_ == 0 && html_title_ptr_ != 0)
                {
                    /* null-terminate the title string */
                    *html_title_ptr_ = '\0';
                    
                    /* tell the OS about the title */
                    if (!html_in_ignore_)
                        set_title_in_os(html_title_buf_);
                }
            }
            else
            {
                /* 
                 *   if we aren't already in a title, set up to capture the
                 *   title into the title buffer 
                 */
                if (!html_in_title_)
                    html_title_ptr_ = html_title_buf_;
                
                /* 
                 *   note that we're in a title and in an ignore section,
                 *   since nothing within gets displayed 
                 */
                ++html_in_ignore_;
                ++html_in_title_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"aboutbox")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"banner"))
        {
            /* turn ignore mode on or off as appropriate */
            if (is_end_tag)
                --html_in_ignore_;
            else
                ++html_in_ignore_;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"log"))
        {
            /* handle the <log> tag according to our stream subclass */
            process_log_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"nolog"))
        {
            /* handle the <nolog> tag according to our stream subclass */
            process_nolog_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"wrap"))
        {
            /* note that we have a 'wrap' tag to process */
            if (!html_in_ignore_)
                html_in_wrap_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"pre"))
        {
            /* count the nesting level if starting PRE mode */
            if (!is_end_tag)
                ++html_pre_level_;

            /* surround the PRE block with blank lines */
            write_blank_line(vmg0_);

            /* count the nesting level if ending PRE mode */
            if (is_end_tag && html_pre_level_ != 0)
                --html_pre_level_;
        }

        /* suppress everything up to the next '>' */
        html_parse_state_ = VMCON_HPS_TAG;

        /* 
         *   return the next character - since we're now in TAG mode, we'll
         *   resume the HTML mini-parser to parse the contents of the tag 
         */
        return c;
    }
    else if (c == '&')
    {
        /* parse the HTML markup */
        wchar_t ent;
        c = parse_entity(vmg_ &ent, sp, slenp);

        /* translate it and write it out */
        buffer_char(vmg_ ent);

        /* proceed with the next character */
        return c;
    }
    else
    {
        /* 
         *   we have nothing special to do with this character - simply
         *   buffer it and move on to the next character 
         */
        buffer_char(vmg_ c);
        return next_wchar(sp, slenp);
    }
}